

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O1

PShm * p_shm_new(pchar *name,psize size,PShmAccessPerms perms,PError **error)

{
  int __fd;
  pint pVar1;
  int iVar2;
  PErrorIPC PVar3;
  PShm *shm;
  size_t sVar4;
  char *pcVar5;
  pchar *ppVar6;
  void *pvVar7;
  PSemaphore *pPVar8;
  byte bVar9;
  stat local_c0;
  
  if (name == (pchar *)0x0) {
    pcVar5 = "Invalid input argument";
    pVar1 = 0x25f;
LAB_0010b858:
    p_error_set_error_p(error,pVar1,0,pcVar5);
    return (PShm *)0x0;
  }
  shm = (PShm *)p_malloc0(0x30);
  if (shm == (PShm *)0x0) {
    pcVar5 = "Failed to allocate memory for shared segment";
    pVar1 = 0x25c;
    goto LAB_0010b858;
  }
  sVar4 = strlen(name);
  pcVar5 = (char *)p_malloc0(sVar4 + 0xe);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "Failed to allocate memory for segment name";
    pVar1 = 0x25c;
  }
  else {
    strcpy(pcVar5,name);
    sVar4 = strlen(pcVar5);
    builtin_strncpy(pcVar5 + sVar4,"_p_shm_object",0xe);
    ppVar6 = p_ipc_get_platform_key(pcVar5,1);
    shm->platform_key = ppVar6;
    shm->perms = perms;
    shm->size = size;
    p_free(pcVar5);
    if (shm->platform_key != (pchar *)0x0) {
      do {
        __fd = shm_open(shm->platform_key,0xc2,0x1b0);
        if (__fd != -1) {
          shm->shm_created = 1;
          bVar9 = 1;
          goto LAB_0010b726;
        }
        pVar1 = p_error_get_last_system();
      } while (pVar1 == 4);
      pVar1 = p_error_get_last_system();
      bVar9 = 1;
      __fd = -1;
      if (pVar1 == 0x11) {
        do {
          __fd = shm_open(shm->platform_key,2,0x1b0);
          if (__fd != -1) {
            bVar9 = 0;
            goto LAB_0010b726;
          }
          pVar1 = p_error_get_last_system();
        } while (pVar1 == 4);
        bVar9 = 0;
        __fd = -1;
      }
LAB_0010b726:
      if (__fd == -1) {
        PVar3 = p_error_get_last_ipc();
        pVar1 = p_error_get_last_system();
        p_error_set_error_p(error,PVar3,pVar1,"Failed to call shm_open() to create memory segment");
      }
      else if (bVar9 == 0) {
        iVar2 = fstat(__fd,&local_c0);
        if (iVar2 != -1) {
          shm->size = local_c0.st_size;
          goto LAB_0010b7a5;
        }
        PVar3 = p_error_get_last_ipc();
        pVar1 = p_error_get_last_system();
        p_error_set_error_p(error,PVar3,pVar1,"Failed to call fstat() to get memory segment size");
        pVar1 = p_sys_close(__fd);
        if (pVar1 != 0) {
          pcVar5 = "PShm::pp_shm_create_handle: p_sys_close() failed(1)";
          goto LAB_0010b95d;
        }
      }
      else {
        iVar2 = ftruncate(__fd,shm->size);
        if (iVar2 == -1) {
          PVar3 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar3,pVar1,
                              "Failed to call ftruncate() to set memory segment size");
          pVar1 = p_sys_close(__fd);
          if (pVar1 == 0) goto LAB_0010b938;
          pcVar5 = "PShm::pp_shm_create_handle: p_sys_close() failed(2)";
LAB_0010b95d:
          printf("** Warning: %s **\n",pcVar5);
        }
        else {
LAB_0010b7a5:
          pvVar7 = mmap((void *)0x0,shm->size,(uint)(shm->perms != P_SHM_ACCESS_READONLY) * 2 + 1,1,
                        __fd,0);
          shm->addr = pvVar7;
          if (pvVar7 == (void *)0xffffffffffffffff) {
            PVar3 = p_error_get_last_ipc();
            pVar1 = p_error_get_last_system();
            p_error_set_error_p(error,PVar3,pVar1,"Failed to call mmap() to map memory segment");
            shm->addr = (ppointer)0x0;
            pVar1 = p_sys_close(__fd);
            if (pVar1 != 0) {
              pcVar5 = "PShm::pp_shm_create_handle: p_sys_close() failed(3)";
              goto LAB_0010b95d;
            }
          }
          else {
            pVar1 = p_sys_close(__fd);
            if (pVar1 != 0) {
              printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(4)");
            }
            pPVar8 = p_semaphore_new(shm->platform_key,1,(uint)bVar9,error);
            shm->sem = pPVar8;
            if (pPVar8 != (PSemaphore *)0x0) {
              if (size == 0) {
                return shm;
              }
              if (shm->size <= size) {
                return shm;
              }
              shm->size = size;
              return shm;
            }
          }
        }
      }
LAB_0010b938:
      pp_shm_clean_handle(shm);
      goto LAB_0010b940;
    }
    pcVar5 = "Invalid input argument";
    pVar1 = 0x25f;
  }
  p_error_set_error_p(error,pVar1,0,pcVar5);
LAB_0010b940:
  p_shm_free(shm);
  return (PShm *)0x0;
}

Assistant:

P_LIB_API PShm *
p_shm_new (const pchar		*name,
	   psize		size,
	   PShmAccessPerms	perms,
	   PError		**error)
{
	PShm	*ret;
	pchar	*new_name;

	if (P_UNLIKELY (name == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PShm))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for shared segment");
		return NULL;
	}

	if (P_UNLIKELY ((new_name = p_malloc0 (strlen (name) + strlen (P_SHM_SUFFIX) + 1)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for segment name");
		p_shm_free (ret);
		return NULL;
	}

	strcpy (new_name, name);
	strcat (new_name, P_SHM_SUFFIX);

#if defined (P_OS_IRIX) || defined (P_OS_TRU64)
	/* IRIX and Tru64 prefer filename styled IPC names */
	ret->platform_key = p_ipc_get_platform_key (new_name, FALSE);
#else
	ret->platform_key = p_ipc_get_platform_key (new_name, TRUE);
#endif
	ret->perms = perms;
	ret->size  = size;

	p_free (new_name);

	if (P_UNLIKELY (pp_shm_create_handle (ret, error) == FALSE)) {
		p_shm_free (ret);
		return NULL;
	}

	if (P_LIKELY (ret->size > size && size != 0))
		ret->size = size;

	return ret;
}